

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O2

int ASN1_STRING_print_ex(BIO *out,ASN1_STRING *str,ulong flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  uchar *local_50;
  char quotes;
  undefined4 uStack_44;
  _union_257 _Stack_40;
  
  iVar4 = str->type;
  iVar2 = 0;
  if ((flags & 0x40) != 0) {
    __s = ASN1_tag2str(iVar4);
    sVar5 = strlen(__s);
    iVar2 = maybe_write((BIO *)out,__s,(int)sVar5);
    if (iVar2 == 0) {
      return -1;
    }
    iVar2 = maybe_write((BIO *)out,":",1);
    if (iVar2 == 0) {
      return -1;
    }
    iVar2 = iVar2 + (int)sVar5;
  }
  if (((char)flags < '\0') ||
     (((iVar3 = 0x1001, (flags & 0x20) == 0 && (iVar3 = string_type_to_encoding(iVar4), iVar3 == -1)
       ) && (iVar3 = 0x1001, ((uint)flags >> 8 & 1) != 0)))) {
    iVar4 = maybe_write((BIO *)out,"#",1);
    if (iVar4 != 0) {
      if (((uint)flags >> 9 & 1) == 0) {
        iVar4 = do_hex_dump((BIO *)out,str->data,str->length);
        if (iVar4 < 0) {
          return -1;
        }
        iVar4 = iVar4 + 1;
      }
      else {
        _quotes = 0;
        uStack_44 = 0;
        _Stack_40.ptr = (char *)0x0;
        asn1_type_set0_string((ASN1_TYPE *)&quotes,(ASN1_STRING *)str);
        local_50 = (uchar *)0x0;
        iVar4 = i2d_ASN1_TYPE((ASN1_TYPE *)&quotes,&local_50);
        if (iVar4 < 0) {
          iVar4 = -1;
        }
        else {
          iVar3 = do_hex_dump((BIO *)out,local_50,iVar4);
          OPENSSL_free(local_50);
          iVar4 = -1;
          if (-1 < iVar3) {
            iVar4 = iVar3 + 1;
          }
        }
      }
      if (-1 < iVar4) {
        return iVar4 + iVar2;
      }
    }
  }
  else {
    _quotes = _quotes & 0xffffffffffffff00;
    iVar4 = do_buf(str->data,str->length,iVar3,flags,&quotes,(BIO *)0x0);
    if (-1 < iVar4) {
      iVar1 = iVar4 + 2;
      if (quotes == '\0') {
        iVar1 = iVar4;
      }
      if (out != (BIO *)0x0) {
        if ((quotes != '\0') && (iVar4 = maybe_write((BIO *)out,"\"",1), iVar4 == 0)) {
          return -1;
        }
        iVar4 = do_buf(str->data,str->length,iVar3,flags,(char *)0x0,(BIO *)out);
        if (iVar4 < 0) {
          return -1;
        }
        if ((quotes != '\0') && (iVar4 = maybe_write((BIO *)out,"\"",1), iVar4 == 0)) {
          return -1;
        }
      }
      return iVar1 + iVar2;
    }
  }
  return -1;
}

Assistant:

int ASN1_STRING_print_ex(BIO *out, const ASN1_STRING *str,
                         unsigned long flags) {
  int type = str->type;
  int outlen = 0;
  if (flags & ASN1_STRFLGS_SHOW_TYPE) {
    const char *tagname = ASN1_tag2str(type);
    outlen += strlen(tagname);
    if (!maybe_write(out, tagname, outlen) || !maybe_write(out, ":", 1)) {
      return -1;
    }
    outlen++;
  }

  // Decide what to do with |str|, either dump the contents or display it.
  int encoding;
  if (flags & ASN1_STRFLGS_DUMP_ALL) {
    // Dump everything.
    encoding = -1;
  } else if (flags & ASN1_STRFLGS_IGNORE_TYPE) {
    // Ignore the string type and interpret the contents as Latin-1.
    encoding = MBSTRING_ASC;
  } else {
    encoding = string_type_to_encoding(type);
    if (encoding == -1 && (flags & ASN1_STRFLGS_DUMP_UNKNOWN) == 0) {
      encoding = MBSTRING_ASC;
    }
  }

  if (encoding == -1) {
    int len = do_dump(flags, out, str);
    if (len < 0) {
      return -1;
    }
    outlen += len;
    return outlen;
  }

  // Measure the length.
  char quotes = 0;
  int len = do_buf(str->data, str->length, encoding, flags, &quotes, NULL);
  if (len < 0) {
    return -1;
  }
  outlen += len;
  if (quotes) {
    outlen += 2;
  }
  if (!out) {
    return outlen;
  }

  // Encode the value.
  if ((quotes && !maybe_write(out, "\"", 1)) ||
      do_buf(str->data, str->length, encoding, flags, NULL, out) < 0 ||
      (quotes && !maybe_write(out, "\"", 1))) {
    return -1;
  }
  return outlen;
}